

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesturemanager.cpp
# Opt level: O2

bool __thiscall
QGestureManager::filterEvent(QGestureManager *this,QGraphicsObject *receiver,QEvent *event)

{
  _Rb_tree_node_base *t;
  QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>
  *pQVar1;
  bool bVar2;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  long in_FS_OFFSET;
  QGraphicsObject *local_a0;
  QMultiMap<QObject_*,_Qt::GestureType> local_98;
  undefined1 local_90 [24];
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_90._16_8_ = &local_78;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_90._0_8_ = 0x10;
  local_90._8_8_ = 0;
  local_98.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::multimap<QObject_*,_Qt::GestureType,_std::less<QObject_*>,_std::allocator<std::pair<QObject_*const,_Qt::GestureType>_>_>_>_>
        )(totally_ordered_wrapper<QMapData<std::multimap<QObject_*,_Qt::GestureType,_std::less<QObject_*>,_std::allocator<std::pair<QObject_*const,_Qt::GestureType>_>_>_>_*>
          )0x0;
  pQVar1 = (((receiver->super_QGraphicsItem).d_ptr.d)->gestureContext).d.d.ptr;
  if ((pQVar1 != (QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>
                  *)0x0) && ((pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    for (p_Var3 = *(_Base_ptr *)
                   ((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
        (_Rb_tree_header *)p_Var3 != &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      QVarLengthArray<Qt::GestureType,_16LL>::append
                ((QVarLengthArray<Qt::GestureType,_16LL> *)local_90,&p_Var3[1]._M_color);
      local_a0 = receiver;
      QMultiMap<QObject_*,_Qt::GestureType>::insert
                (&local_98,(QObject **)&local_a0,&p_Var3[1]._M_color);
    }
  }
  while (receiver = QGraphicsItem::parentObject(&receiver->super_QGraphicsItem),
        receiver != (QGraphicsObject *)0x0) {
    pQVar1 = (((receiver->super_QGraphicsItem).d_ptr.d)->gestureContext).d.d.ptr;
    if (pQVar1 == (QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>
                   *)0x0) {
      p_Var3 = (_Base_ptr)0x0;
    }
    else {
      p_Var3 = *(_Base_ptr *)
                ((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
    }
    p_Var4 = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (pQVar1 == (QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>
                   *)0x0) {
      p_Var4 = (_Rb_tree_node_base *)0x0;
    }
    for (; p_Var3 != p_Var4; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      if ((p_Var3[1].field_0x4 & 1) == 0) {
        t = p_Var3 + 1;
        bVar2 = QVLABase<Qt::GestureType>::contains<Qt::GestureType>
                          ((QVLABase<Qt::GestureType> *)local_90,&t->_M_color);
        if (!bVar2) {
          QVarLengthArray<Qt::GestureType,_16LL>::append
                    ((QVarLengthArray<Qt::GestureType,_16LL> *)local_90,&t->_M_color);
          local_a0 = receiver;
          QMultiMap<QObject_*,_Qt::GestureType>::insert
                    (&local_98,(QObject **)&local_a0,&t->_M_color);
        }
      }
    }
  }
  if ((local_98.d.d.ptr ==
       (totally_ordered_wrapper<QMapData<std::multimap<QObject_*,_Qt::GestureType,_std::less<QObject_*>,_std::allocator<std::pair<QObject_*const,_Qt::GestureType>_>_>_>_*>
        )0x0) || (*(size_t *)((long)local_98.d.d.ptr + 0x30) == 0)) {
    bVar2 = false;
  }
  else {
    bVar2 = filterEventThroughContexts(this,&local_98,event);
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<QObject_*,_Qt::GestureType,_std::less<QObject_*>,_std::allocator<std::pair<QObject_*const,_Qt::GestureType>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_98.d);
  QVarLengthArray<Qt::GestureType,_16LL>::~QVarLengthArray
            ((QVarLengthArray<Qt::GestureType,_16LL> *)local_90);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QGestureManager::filterEvent(QGraphicsObject *receiver, QEvent *event)
{
    QVarLengthArray<Qt::GestureType, 16> types;
    QMultiMap<QObject *, Qt::GestureType> contexts;
    QGraphicsObject *item = receiver;
    if (!item->QGraphicsItem::d_func()->gestureContext.isEmpty()) {
        typedef QMap<Qt::GestureType, Qt::GestureFlags>::const_iterator ContextIterator;
        for(ContextIterator it = item->QGraphicsItem::d_func()->gestureContext.constBegin(),
            e = item->QGraphicsItem::d_func()->gestureContext.constEnd(); it != e; ++it) {
            types.push_back(it.key());
            contexts.insert(item, it.key());
        }
    }
    // find all gesture contexts for the graphics object tree
    item = item->parentObject();
    while (item)
    {
        typedef QMap<Qt::GestureType, Qt::GestureFlags>::const_iterator ContextIterator;
        for (ContextIterator it = item->QGraphicsItem::d_func()->gestureContext.constBegin(),
             e = item->QGraphicsItem::d_func()->gestureContext.constEnd(); it != e; ++it) {
            if (!(it.value() & Qt::DontStartGestureOnChildren)) {
                if (!types.contains(it.key())) {
                    types.push_back(it.key());
                    contexts.insert(item, it.key());
                }
            }
        }
        item = item->parentObject();
    }
    return contexts.isEmpty() ? false : filterEventThroughContexts(contexts, event);
}